

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

void google::protobuf::TestUtil::ExpectRepeatedFieldsModified<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  RepeatedField<int> *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  internal iVar1;
  const_reference piVar2;
  const_reference plVar3;
  const_reference puVar4;
  const_reference puVar5;
  const_reference pfVar6;
  const_reference pdVar7;
  const_reference pbVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar9;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar10;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar11;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *pVVar12;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar13;
  RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *this_02;
  pointer *__ptr;
  char *pcVar14;
  char *in_R9;
  pointer *__ptr_2;
  pointer *__ptr_5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  AssertHelper local_d0;
  RepeatedField<int> *local_c8;
  RepeatedField<int> *local_c0;
  RepeatedField<int> *local_b8;
  RepeatedField<bool> *local_b0;
  RepeatedField<double> *local_a8;
  RepeatedField<float> *local_a0;
  RepeatedField<long> *local_98;
  RepeatedField<int> *local_90;
  RepeatedField<unsigned_long> *local_88;
  RepeatedField<unsigned_int> *local_80;
  RepeatedField<long> *local_78;
  RepeatedField<int> *local_70;
  RepeatedField<unsigned_long> *local_68;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_100._M_head_impl._0_4_ = 2;
  this = &(message->field_0)._impl_.repeated_int32_;
  local_108.data_._0_4_ =
       (float)protobuf::internal::SooRep::size
                        (&this->soo_rep_,
                         (undefined1  [816])
                         ((undefined1  [816])message->field_0 & (undefined1  [816])0x4) ==
                         (undefined1  [816])0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f0,"2","message.repeated_int32_size()",(int *)&local_100,
             (int *)&local_108);
  iVar1 = local_f0[0];
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar14 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x87e,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  if (iVar1 != (internal)0x0) {
    local_100._M_head_impl._0_4_ = 2;
    this_00 = &(message->field_0)._impl_.repeated_int64_;
    local_108.data_._0_4_ =
         (float)protobuf::internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0x20) & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_f0,"2","message.repeated_int64_size()",(int *)&local_100,
               (int *)&local_108);
    iVar1 = local_f0[0];
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar14 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar14 = (local_e8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0x87f,pcVar14);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
    if (iVar1 != (internal)0x0) {
      local_100._M_head_impl._0_4_ = 2;
      this_01 = &(message->field_0)._impl_.repeated_uint32_;
      local_108.data_._0_4_ =
           (float)protobuf::internal::SooRep::size
                            (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0
                            );
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_f0,"2","message.repeated_uint32_size()",(int *)&local_100,
                 (int *)&local_108);
      iVar1 = local_f0[0];
      if (local_f0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_100);
        if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar14 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar14 = (local_e8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0x880,pcVar14);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e8,local_e8);
      }
      if (iVar1 != (internal)0x0) {
        local_100._M_head_impl._0_4_ = 2;
        local_68 = &(message->field_0)._impl_.repeated_uint64_;
        local_108.data_._0_4_ =
             (float)protobuf::internal::SooRep::size
                              (&local_68->soo_rep_,
                               (*(byte *)((long)&message->field_0 + 0x40) & 4) == 0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_f0,"2","message.repeated_uint64_size()",(int *)&local_100,
                   (int *)&local_108);
        iVar1 = local_f0[0];
        if (local_f0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_100);
          if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar14 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar14 = (local_e8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0x881,pcVar14);
          testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_108);
          if (local_100._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_100._M_head_impl + 8))();
          }
        }
        if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_e8,local_e8);
        }
        if (iVar1 != (internal)0x0) {
          local_100._M_head_impl._0_4_ = 2;
          local_70 = &(message->field_0)._impl_.repeated_sint32_;
          local_108.data_._0_4_ =
               (float)protobuf::internal::SooRep::size
                                (&local_70->soo_rep_,
                                 (*(byte *)((long)&message->field_0 + 0x50) & 4) == 0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_f0,"2","message.repeated_sint32_size()",(int *)&local_100,
                     (int *)&local_108);
          iVar1 = local_f0[0];
          if (local_f0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_100);
            if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar14 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar14 = (local_e8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_108,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0x882,pcVar14);
            testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
            testing::internal::AssertHelper::~AssertHelper(&local_108);
            if (local_100._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_100._M_head_impl + 8))();
            }
          }
          if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_e8,local_e8);
          }
          if (iVar1 != (internal)0x0) {
            local_100._M_head_impl._0_4_ = 2;
            local_78 = &(message->field_0)._impl_.repeated_sint64_;
            local_108.data_._0_4_ =
                 (float)protobuf::internal::SooRep::size
                                  (&local_78->soo_rep_,
                                   (*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_f0,"2","message.repeated_sint64_size()",(int *)&local_100,
                       (int *)&local_108);
            iVar1 = local_f0[0];
            if (local_f0[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_100);
              if (local_e8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar14 = anon_var_dwarf_a12c75 + 5;
              }
              else {
                pcVar14 = (local_e8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_108,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0x883,pcVar14);
              testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
              testing::internal::AssertHelper::~AssertHelper(&local_108);
              if (local_100._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_100._M_head_impl + 8))();
              }
            }
            if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_e8,local_e8);
            }
            if (iVar1 != (internal)0x0) {
              local_100._M_head_impl._0_4_ = 2;
              local_80 = &(message->field_0)._impl_.repeated_fixed32_;
              local_108.data_._0_4_ =
                   (float)protobuf::internal::SooRep::size
                                    (&local_80->soo_rep_,
                                     (*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_f0,"2","message.repeated_fixed32_size()",
                         (int *)&local_100,(int *)&local_108);
              iVar1 = local_f0[0];
              if (local_f0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_100);
                if (local_e8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar14 = anon_var_dwarf_a12c75 + 5;
                }
                else {
                  pcVar14 = (local_e8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0x884,pcVar14);
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                testing::internal::AssertHelper::~AssertHelper(&local_108);
                if (local_100._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_100._M_head_impl + 8))();
                }
              }
              if (local_e8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_e8,local_e8);
              }
              if (iVar1 != (internal)0x0) {
                local_100._M_head_impl._0_4_ = 2;
                local_88 = &(message->field_0)._impl_.repeated_fixed64_;
                local_108.data_._0_4_ =
                     (float)protobuf::internal::SooRep::size
                                      (&local_88->soo_rep_,
                                       (*(byte *)((long)&message->field_0 + 0x80) & 4) == 0);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_f0,"2","message.repeated_fixed64_size()",
                           (int *)&local_100,(int *)&local_108);
                iVar1 = local_f0[0];
                if (local_f0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_100);
                  if (local_e8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                  }
                  else {
                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_108,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0x885,pcVar14);
                  testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                  testing::internal::AssertHelper::~AssertHelper(&local_108);
                  if (local_100._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_100._M_head_impl + 8))();
                  }
                }
                if (local_e8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_e8,local_e8);
                }
                if (iVar1 != (internal)0x0) {
                  local_100._M_head_impl._0_4_ = 2;
                  local_90 = &(message->field_0)._impl_.repeated_sfixed32_;
                  local_108.data_._0_4_ =
                       (float)protobuf::internal::SooRep::size
                                        (&local_90->soo_rep_,
                                         (*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_f0,"2","message.repeated_sfixed32_size()",
                             (int *)&local_100,(int *)&local_108);
                  iVar1 = local_f0[0];
                  if (local_f0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_100);
                    if (local_e8 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar14 = anon_var_dwarf_a12c75 + 5;
                    }
                    else {
                      pcVar14 = (local_e8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_108,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0x886,pcVar14);
                    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                    testing::internal::AssertHelper::~AssertHelper(&local_108);
                    if (local_100._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_100._M_head_impl + 8))();
                    }
                  }
                  if (local_e8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_e8,local_e8);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_100._M_head_impl._0_4_ = 2;
                    local_98 = &(message->field_0)._impl_.repeated_sfixed64_;
                    local_108.data_._0_4_ =
                         (float)protobuf::internal::SooRep::size
                                          (&local_98->soo_rep_,
                                           (*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_f0,"2","message.repeated_sfixed64_size()",
                               (int *)&local_100,(int *)&local_108);
                    iVar1 = local_f0[0];
                    if (local_f0[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_100);
                      if (local_e8 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar14 = anon_var_dwarf_a12c75 + 5;
                      }
                      else {
                        pcVar14 = (local_e8->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_108,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0x887,pcVar14);
                      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                      testing::internal::AssertHelper::~AssertHelper(&local_108);
                      if (local_100._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_100._M_head_impl + 8))();
                      }
                    }
                    if (local_e8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_e8,local_e8);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_100._M_head_impl._0_4_ = 2;
                      local_a0 = &(message->field_0)._impl_.repeated_float_;
                      local_108.data_._0_4_ =
                           (float)protobuf::internal::SooRep::size
                                            (&local_a0->soo_rep_,
                                             (*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_f0,"2","message.repeated_float_size()",
                                 (int *)&local_100,(int *)&local_108);
                      iVar1 = local_f0[0];
                      if (local_f0[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_100);
                        if (local_e8 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar14 = anon_var_dwarf_a12c75 + 5;
                        }
                        else {
                          pcVar14 = (local_e8->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_108,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0x888,pcVar14);
                        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_108);
                        if (local_100._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_100._M_head_impl + 8))();
                        }
                      }
                      if (local_e8 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_e8,local_e8);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_100._M_head_impl._0_4_ = 2;
                        local_a8 = &(message->field_0)._impl_.repeated_double_;
                        local_108.data_._0_4_ =
                             (float)protobuf::internal::SooRep::size
                                              (&local_a8->soo_rep_,
                                               (*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0)
                        ;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_f0,"2","message.repeated_double_size()",
                                   (int *)&local_100,(int *)&local_108);
                        iVar1 = local_f0[0];
                        if (local_f0[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_100);
                          if (local_e8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar14 = anon_var_dwarf_a12c75 + 5;
                          }
                          else {
                            pcVar14 = (local_e8->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_108,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0x889,pcVar14);
                          testing::internal::AssertHelper::operator=
                                    (&local_108,(Message *)&local_100);
                          testing::internal::AssertHelper::~AssertHelper(&local_108);
                          if (local_100._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_100._M_head_impl + 8))();
                          }
                        }
                        if (local_e8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_e8,local_e8);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_100._M_head_impl._0_4_ = 2;
                          local_b0 = &(message->field_0)._impl_.repeated_bool_;
                          local_108.data_._0_4_ =
                               (float)protobuf::internal::SooRep::size
                                                (&local_b0->soo_rep_,
                                                 (*(byte *)((long)&message->field_0 + 0xd0) & 4) ==
                                                 0);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_f0,"2","message.repeated_bool_size()",
                                     (int *)&local_100,(int *)&local_108);
                          iVar1 = local_f0[0];
                          if (local_f0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_100);
                            if (local_e8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar14 = anon_var_dwarf_a12c75 + 5;
                            }
                            else {
                              pcVar14 = (local_e8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_108,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0x88a,pcVar14);
                            testing::internal::AssertHelper::operator=
                                      (&local_108,(Message *)&local_100);
                            testing::internal::AssertHelper::~AssertHelper(&local_108);
                            if (local_100._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_100._M_head_impl + 8))();
                            }
                          }
                          if (local_e8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_e8,local_e8);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_100._M_head_impl._0_4_ = 2;
                            local_108.data_._0_4_ = *(float *)((long)&message->field_0 + 0xe8);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_f0,"2","message.repeated_string_size()",
                                       (int *)&local_100,(int *)&local_108);
                            iVar1 = local_f0[0];
                            if (local_f0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_100);
                              if (local_e8 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar14 = anon_var_dwarf_a12c75 + 5;
                              }
                              else {
                                pcVar14 = (local_e8->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_108,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0x88b,pcVar14);
                              testing::internal::AssertHelper::operator=
                                        (&local_108,(Message *)&local_100);
                              testing::internal::AssertHelper::~AssertHelper(&local_108);
                              if (local_100._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_100._M_head_impl + 8))();
                              }
                            }
                            if (local_e8 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_e8,local_e8);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_100._M_head_impl._0_4_ = 2;
                              local_108.data_._0_4_ = *(float *)((long)&message->field_0 + 0x100);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_f0,"2","message.repeated_bytes_size()",
                                         (int *)&local_100,(int *)&local_108);
                              iVar1 = local_f0[0];
                              if (local_f0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_100);
                                if (local_e8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar14 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar14 = (local_e8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_108,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0x88c,pcVar14);
                                testing::internal::AssertHelper::operator=
                                          (&local_108,(Message *)&local_100);
                                testing::internal::AssertHelper::~AssertHelper(&local_108);
                                if (local_100._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                }
                              }
                              if (local_e8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_e8,local_e8);
                              }
                              if (iVar1 != (internal)0x0) {
                                local_100._M_head_impl._0_4_ = 2;
                                local_108.data_._0_4_ = *(float *)((long)&message->field_0 + 0x118);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)local_f0,"2","message.repeatedgroup_size()",
                                           (int *)&local_100,(int *)&local_108);
                                iVar1 = local_f0[0];
                                if (local_f0[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_100);
                                  if (local_e8 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                  }
                                  else {
                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_108,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0x88e,pcVar14);
                                  testing::internal::AssertHelper::operator=
                                            (&local_108,(Message *)&local_100);
                                  testing::internal::AssertHelper::~AssertHelper(&local_108);
                                  if (local_100._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                  }
                                }
                                if (local_e8 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_e8,local_e8);
                                }
                                if (iVar1 != (internal)0x0) {
                                  local_100._M_head_impl._0_4_ = 2;
                                  local_108.data_._0_4_ =
                                       *(float *)((long)&message->field_0 + 0x130);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)local_f0,"2",
                                             "message.repeated_nested_message_size()",
                                             (int *)&local_100,(int *)&local_108);
                                  iVar1 = local_f0[0];
                                  if (local_f0[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_100);
                                    if (local_e8 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar14 = anon_var_dwarf_a12c75 + 5;
                                    }
                                    else {
                                      pcVar14 = (local_e8->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_108,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0x88f,pcVar14);
                                    testing::internal::AssertHelper::operator=
                                              (&local_108,(Message *)&local_100);
                                    testing::internal::AssertHelper::~AssertHelper(&local_108);
                                    if (local_100._M_head_impl !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                    }
                                  }
                                  if (local_e8 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                  }
                                  if (iVar1 != (internal)0x0) {
                                    local_100._M_head_impl._0_4_ = 2;
                                    local_108.data_._0_4_ =
                                         *(float *)((long)&message->field_0 + 0x148);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_f0,"2",
                                               "message.repeated_foreign_message_size()",
                                               (int *)&local_100,(int *)&local_108);
                                    iVar1 = local_f0[0];
                                    if (local_f0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_100);
                                      if (local_e8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar14 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar14 = (local_e8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_108,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0x890,pcVar14);
                                      testing::internal::AssertHelper::operator=
                                                (&local_108,(Message *)&local_100);
                                      testing::internal::AssertHelper::~AssertHelper(&local_108);
                                      if (local_100._M_head_impl !=
                                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                      }
                                    }
                                    if (local_e8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                    }
                                    if (iVar1 != (internal)0x0) {
                                      local_100._M_head_impl._0_4_ = 2;
                                      local_108.data_._0_4_ =
                                           *(float *)((long)&message->field_0 + 0x160);
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_f0,"2",
                                                 "message.repeated_import_message_size()",
                                                 (int *)&local_100,(int *)&local_108);
                                      iVar1 = local_f0[0];
                                      if (local_f0[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_100);
                                        if (local_e8 ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar14 = anon_var_dwarf_a12c75 + 5;
                                        }
                                        else {
                                          pcVar14 = (local_e8->_M_dataplus)._M_p;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_108,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x891,pcVar14);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_108,(Message *)&local_100);
                                        testing::internal::AssertHelper::~AssertHelper(&local_108);
                                        if (local_100._M_head_impl !=
                                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                        }
                                      }
                                      if (local_e8 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                      }
                                      if (iVar1 != (internal)0x0) {
                                        local_100._M_head_impl._0_4_ = 2;
                                        local_108.data_._0_4_ =
                                             *(float *)((long)&message->field_0 + 0x1d8);
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)local_f0,"2",
                                                   "message.repeated_lazy_message_size()",
                                                   (int *)&local_100,(int *)&local_108);
                                        iVar1 = local_f0[0];
                                        if (local_f0[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&local_100);
                                          if (local_e8 ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar14 = anon_var_dwarf_a12c75 + 5;
                                          }
                                          else {
                                            pcVar14 = (local_e8->_M_dataplus)._M_p;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_108,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x892,pcVar14);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_108,(Message *)&local_100);
                                          testing::internal::AssertHelper::~AssertHelper(&local_108)
                                          ;
                                          if (local_100._M_head_impl !=
                                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                          }
                                        }
                                        if (local_e8 !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                        }
                                        if (iVar1 != (internal)0x0) {
                                          local_100._M_head_impl._0_4_ = 2;
                                          local_b8 = &(message->field_0)._impl_.
                                                      repeated_nested_enum_;
                                          local_108.data_._0_4_ =
                                               (float)protobuf::internal::SooRep::size
                                                                (&local_b8->soo_rep_,
                                                                 (*(byte *)((long)&message->field_0
                                                                           + 0x170) & 4) == 0);
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)local_f0,"2",
                                                     "message.repeated_nested_enum_size()",
                                                     (int *)&local_100,(int *)&local_108);
                                          iVar1 = local_f0[0];
                                          if (local_f0[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&local_100);
                                            if (local_e8 ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar14 = anon_var_dwarf_a12c75 + 5;
                                            }
                                            else {
                                              pcVar14 = (local_e8->_M_dataplus)._M_p;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_108,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x893,pcVar14);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_108,(Message *)&local_100);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_108);
                                            if (local_100._M_head_impl !=
                                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              (**(code **)(*(long *)local_100._M_head_impl + 8))();
                                            }
                                          }
                                          if (local_e8 !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                          }
                                          if (iVar1 != (internal)0x0) {
                                            local_100._M_head_impl._0_4_ = 2;
                                            local_c0 = &(message->field_0)._impl_.
                                                        repeated_foreign_enum_;
                                            local_108.data_._0_4_ =
                                                 (float)protobuf::internal::SooRep::size
                                                                  (&local_c0->soo_rep_,
                                                                   (*(byte *)((long)&message->
                                                  field_0 + 0x180) & 4) == 0);
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)local_f0,"2",
                                                       "message.repeated_foreign_enum_size()",
                                                       (int *)&local_100,(int *)&local_108);
                                            iVar1 = local_f0[0];
                                            if (local_f0[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)&local_100);
                                              if (local_e8 ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar14 = anon_var_dwarf_a12c75 + 5;
                                              }
                                              else {
                                                pcVar14 = (local_e8->_M_dataplus)._M_p;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_108,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x894,pcVar14);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_108,(Message *)&local_100);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_108);
                                              if (local_100._M_head_impl !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                (**(code **)(*(long *)local_100._M_head_impl + 8))()
                                                ;
                                              }
                                            }
                                            if (local_e8 !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                            }
                                            if (iVar1 != (internal)0x0) {
                                              local_100._M_head_impl._0_4_ = 2;
                                              local_c8 = &(message->field_0)._impl_.
                                                          repeated_import_enum_;
                                              local_108.data_._0_4_ =
                                                   (float)protobuf::internal::SooRep::size
                                                                    (&local_c8->soo_rep_,
                                                                     (*(byte *)((long)&message->
                                                  field_0 + 400) & 4) == 0);
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)local_f0,"2",
                                                         "message.repeated_import_enum_size()",
                                                         (int *)&local_100,(int *)&local_108);
                                              iVar1 = local_f0[0];
                                              if (local_f0[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)&local_100);
                                                if (local_e8 ==
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                }
                                                else {
                                                  pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_108,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x895,pcVar14);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_108,(Message *)&local_100);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_108);
                                                if (local_100._M_head_impl !=
                                                    (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  (**(code **)(*(long *)local_100._M_head_impl + 8))
                                                            ();
                                                }
                                              }
                                              if (local_e8 !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                              }
                                              if (iVar1 != (internal)0x0) {
                                                local_100._M_head_impl._0_4_ = 2;
                                                local_108.data_._0_4_ =
                                                     *(float *)((long)&message->field_0 + 0x1a8);
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f0,"2",
                                                           "message.repeated_string_piece_size()",
                                                           (int *)&local_100,(int *)&local_108);
                                                iVar1 = local_f0[0];
                                                if (local_f0[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_100);
                                                  if (local_e8 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x898,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_e8 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                }
                                                if (iVar1 != (internal)0x0) {
                                                  local_100._M_head_impl._0_4_ = 2;
                                                  local_108.data_._0_4_ =
                                                       *(float *)((long)&message->field_0 + 0x1c0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"2",
                                                             "message.repeated_cord_size()",
                                                             (int *)&local_100,(int *)&local_108);
                                                  iVar1 = local_f0[0];
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x899,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  if (iVar1 != (internal)0x0) {
                                                    local_100._M_head_impl._0_4_ = 0xc9;
                                                    piVar2 = RepeatedField<int>::Get(this,0);
                                                    local_108.data_._0_4_ = (float)*piVar2;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)local_f0,"201",
                                                               "message.repeated_int32(0)",
                                                               (int *)&local_100,(int *)&local_108);
                                                    if (local_f0[0] == (internal)0x0) {
                                                      testing::Message::Message
                                                                ((Message *)&local_100);
                                                      if (local_e8 ==
                                                          (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x89c,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 2.83062e-43;
                                                  plVar3 = RepeatedField<long>::Get(this_00,0);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar3;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f0,"202",
                                                             "message.repeated_int64(0)",
                                                             (int *)&local_108,(long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x89d,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xcb;
                                                  puVar4 = RepeatedField<unsigned_int>::Get
                                                                     (this_01,0);
                                                  local_108.data_._0_4_ = (float)*puVar4;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f0,"203",
                                                             "message.repeated_uint32(0)",
                                                             (int *)&local_100,(uint *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x89e,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 2.85865e-43;
                                                  puVar5 = RepeatedField<unsigned_long>::Get
                                                                     (local_68,0);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar5;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f0,"204",
                                                             "message.repeated_uint64(0)",
                                                             (int *)&local_108,
                                                             (unsigned_long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x89f,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xcd;
                                                  piVar2 = RepeatedField<int>::Get(local_70,0);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"205",
                                                             "message.repeated_sint32(0)",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a0,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 2.88667e-43;
                                                  plVar3 = RepeatedField<long>::Get(local_78,0);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar3;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f0,"206",
                                                             "message.repeated_sint64(0)",
                                                             (int *)&local_108,(long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a1,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xcf;
                                                  puVar4 = RepeatedField<unsigned_int>::Get
                                                                     (local_80,0);
                                                  local_108.data_._0_4_ = (float)*puVar4;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f0,"207",
                                                             "message.repeated_fixed32(0)",
                                                             (int *)&local_100,(uint *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a2,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 2.9147e-43;
                                                  puVar5 = RepeatedField<unsigned_long>::Get
                                                                     (local_88,0);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar5;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f0,"208",
                                                             "message.repeated_fixed64(0)",
                                                             (int *)&local_108,
                                                             (unsigned_long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a3,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xd1;
                                                  piVar2 = RepeatedField<int>::Get(local_90,0);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"209",
                                                             "message.repeated_sfixed32(0)",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a4,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 2.94273e-43;
                                                  plVar3 = RepeatedField<long>::Get(local_98,0);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar3;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f0,"210",
                                                             "message.repeated_sfixed64(0)",
                                                             (int *)&local_108,(long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a5,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xd3;
                                                  pfVar6 = RepeatedField<float>::Get(local_a0,0);
                                                  local_108.data_._0_4_ = *pfVar6;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_f0,"211",
                                                             "message.repeated_float(0)",
                                                             (int *)&local_100,(float *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a6,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 2.97075e-43;
                                                  pdVar7 = RepeatedField<double>::Get(local_a8,0);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*pdVar7;
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_f0,"212",
                                                             "message.repeated_double(0)",
                                                             (int *)&local_108,(double *)&local_100)
                                                  ;
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a7,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  pbVar8 = RepeatedField<bool>::Get(local_b0,0);
                                                  local_100._M_head_impl._0_1_ = *pbVar8;
                                                  local_f8 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (*pbVar8 == false) {
                                                    testing::Message::Message((Message *)&local_108)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f0,
                                                               (internal *)&local_100,
                                                               (AssertionResult *)
                                                               "message.repeated_bool(0)","false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a8,(char *)CONCAT71(local_f0._1_7_,local_f0[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d0,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f0._1_7_,local_f0[0]) !=
                                                  &local_e0) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                                  local_e0._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_108.data_._4_4_,
                                                                       local_108.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_108.data_.
                                                                                   _4_4_,local_108.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_f8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f8,local_f8);
                                                  }
                                                  local_38 = &(message->field_0)._impl_.
                                                              repeated_string_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar9 = protobuf::internal::RepeatedPtrFieldBase
                                                           ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_38,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_f0,"\"215\"",
                                                             "message.repeated_string(0)",
                                                             (char (*) [4])"215",pVVar9);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8a9,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_40 = &(message->field_0)._impl_.
                                                              repeated_bytes_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar9 = protobuf::internal::RepeatedPtrFieldBase
                                                           ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_40,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_f0,"\"216\"",
                                                             "message.repeated_bytes(0)",
                                                             (char (*) [4])"216",pVVar9);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8aa,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xd9;
                                                  local_48 = &(message->field_0)._impl_.
                                                              repeatedgroup_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar10 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                                                            (local_48,0);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar10->field_0)._impl_.a_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"217",
                                                             "message.repeatedgroup(0).a()",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8ac,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xda;
                                                  local_50 = &(message->field_0)._impl_.
                                                              repeated_nested_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar11 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                                                            (local_50,0);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar11->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"218",
                                                                                                                          
                                                  "message.repeated_nested_message(0).bb()",
                                                  (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8ad,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xdb;
                                                  local_58 = &(message->field_0)._impl_.
                                                              repeated_foreign_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar12 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                                                            (local_58,0);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar12->field_0)._impl_.c_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"219",
                                                                                                                          
                                                  "message.repeated_foreign_message(0).c()",
                                                  (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8ae,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xdc;
                                                  local_60 = &(message->field_0)._impl_.
                                                              repeated_import_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar13 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                                                            (local_60,0);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar13->field_0)._impl_.d_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"220",
                                                                                                                          
                                                  "message.repeated_import_message(0).d()",
                                                  (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8af,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0xe3;
                                                  this_02 = &(message->field_0)._impl_.
                                                             repeated_lazy_message_;
                                                  pVVar11 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                                                            (&this_02->super_RepeatedPtrFieldBase,0)
                                                  ;
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar11->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"227",
                                                             "message.repeated_lazy_message(0).bb()"
                                                             ,(int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8b0,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  piVar2 = RepeatedField<int>::Get(local_b8,0);
                                                  local_100._M_head_impl._0_4_ = *piVar2;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
                                                            ((internal *)local_f0,
                                                             "TestAllTypes::BAR",
                                                             "message.repeated_nested_enum(0)",
                                                             &proto2_unittest::TestAllTypes::BAR,
                                                             (TestAllTypes_NestedEnum *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8b2,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 5;
                                                  piVar2 = RepeatedField<int>::Get(local_c0,0);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
                                                            ((internal *)local_f0,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_BAR",
                                                  "message.repeated_foreign_enum(0)",
                                                  (ForeignEnum *)&local_100,
                                                  (ForeignEnum *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8b4,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 8;
                                                  piVar2 = RepeatedField<int>::Get(local_c8,0);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
                                                            ((internal *)local_f0,
                                                             "ImportEnum<TestAllTypes>::IMPORT_BAR",
                                                             "message.repeated_import_enum(0)",
                                                             (ImportEnum *)&local_100,
                                                             (ImportEnum *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8b6,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x1f5;
                                                  piVar2 = RepeatedField<int>::Get(this,1);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"501",
                                                             "message.repeated_int32(1)",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8ba,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 7.03452e-43;
                                                  plVar3 = RepeatedField<long>::Get(this_00,1);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar3;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f0,"502",
                                                             "message.repeated_int64(1)",
                                                             (int *)&local_108,(long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8bb,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x1f7;
                                                  puVar4 = RepeatedField<unsigned_int>::Get
                                                                     (this_01,1);
                                                  local_108.data_._0_4_ = (float)*puVar4;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f0,"503",
                                                             "message.repeated_uint32(1)",
                                                             (int *)&local_100,(uint *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8bc,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 7.06254e-43;
                                                  puVar5 = RepeatedField<unsigned_long>::Get
                                                                     (local_68,1);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar5;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f0,"504",
                                                             "message.repeated_uint64(1)",
                                                             (int *)&local_108,
                                                             (unsigned_long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8bd,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x1f9;
                                                  piVar2 = RepeatedField<int>::Get(local_70,1);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"505",
                                                             "message.repeated_sint32(1)",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8be,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 7.09057e-43;
                                                  plVar3 = RepeatedField<long>::Get(local_78,1);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar3;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f0,"506",
                                                             "message.repeated_sint64(1)",
                                                             (int *)&local_108,(long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8bf,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x1fb;
                                                  puVar4 = RepeatedField<unsigned_int>::Get
                                                                     (local_80,1);
                                                  local_108.data_._0_4_ = (float)*puVar4;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f0,"507",
                                                             "message.repeated_fixed32(1)",
                                                             (int *)&local_100,(uint *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c0,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 7.1186e-43;
                                                  puVar5 = RepeatedField<unsigned_long>::Get
                                                                     (local_88,1);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar5;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f0,"508",
                                                             "message.repeated_fixed64(1)",
                                                             (int *)&local_108,
                                                             (unsigned_long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c1,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x1fd;
                                                  piVar2 = RepeatedField<int>::Get(local_90,1);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"509",
                                                             "message.repeated_sfixed32(1)",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c2,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 7.14662e-43;
                                                  plVar3 = RepeatedField<long>::Get(local_98,1);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar3;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f0,"510",
                                                             "message.repeated_sfixed64(1)",
                                                             (int *)&local_108,(long *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c3,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x1ff;
                                                  pfVar6 = RepeatedField<float>::Get(local_a0,1);
                                                  local_108.data_._0_4_ = *pfVar6;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_f0,"511",
                                                             "message.repeated_float(1)",
                                                             (int *)&local_100,(float *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c4,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_108.data_._0_4_ = 7.17465e-43;
                                                  pdVar7 = RepeatedField<double>::Get(local_a8,1);
                                                  local_100._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*pdVar7;
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_f0,"512",
                                                             "message.repeated_double(1)",
                                                             (int *)&local_108,(double *)&local_100)
                                                  ;
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c5,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  pbVar8 = RepeatedField<bool>::Get(local_b0,1);
                                                  local_100._M_head_impl._0_1_ = *pbVar8;
                                                  local_f8 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (*pbVar8 == false) {
                                                    testing::Message::Message((Message *)&local_108)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f0,
                                                               (internal *)&local_100,
                                                               (AssertionResult *)
                                                               "message.repeated_bool(1)","false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c6,(char *)CONCAT71(local_f0._1_7_,local_f0[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d0,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f0._1_7_,local_f0[0]) !=
                                                  &local_e0) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                                  local_e0._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_108.data_._4_4_,
                                                                       local_108.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_108.data_.
                                                                                   _4_4_,local_108.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_f8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f8,local_f8);
                                                  }
                                                  pVVar9 = protobuf::internal::RepeatedPtrFieldBase
                                                           ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_38,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_f0,"\"515\"",
                                                             "message.repeated_string(1)",
                                                             (char (*) [4])"515",pVVar9);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c7,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  pVVar9 = protobuf::internal::RepeatedPtrFieldBase
                                                           ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_40,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)local_f0,"\"516\"",
                                                             "message.repeated_bytes(1)",
                                                             (char (*) [4])"516",pVVar9);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8c8,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x205;
                                                  pVVar10 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                                                            (local_48,1);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar10->field_0)._impl_.a_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"517",
                                                             "message.repeatedgroup(1).a()",
                                                             (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8ca,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x206;
                                                  pVVar11 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                                                            (local_50,1);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar11->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"518",
                                                                                                                          
                                                  "message.repeated_nested_message(1).bb()",
                                                  (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8cb,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x207;
                                                  pVVar12 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                                                            (local_58,1);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar12->field_0)._impl_.c_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"519",
                                                                                                                          
                                                  "message.repeated_foreign_message(1).c()",
                                                  (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8cc,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x208;
                                                  pVVar13 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                                                            (local_60,1);
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar13->field_0)._impl_.d_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"520",
                                                                                                                          
                                                  "message.repeated_import_message(1).d()",
                                                  (int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8cd,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 0x20f;
                                                  pVVar11 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                                                            (&this_02->super_RepeatedPtrFieldBase,1)
                                                  ;
                                                  local_108.data_._0_4_ =
                                                       (float)(pVVar11->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f0,"527",
                                                             "message.repeated_lazy_message(1).bb()"
                                                             ,(int *)&local_100,(int *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8ce,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  piVar2 = RepeatedField<int>::Get(local_b8,1);
                                                  local_100._M_head_impl._0_4_ = *piVar2;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
                                                            ((internal *)local_f0,
                                                             "TestAllTypes::FOO",
                                                             "message.repeated_nested_enum(1)",
                                                             &proto2_unittest::TestAllTypes::FOO,
                                                             (TestAllTypes_NestedEnum *)&local_100);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8d0,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 4;
                                                  piVar2 = RepeatedField<int>::Get(local_c0,1);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
                                                            ((internal *)local_f0,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_FOO",
                                                  "message.repeated_foreign_enum(1)",
                                                  (ForeignEnum *)&local_100,
                                                  (ForeignEnum *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8d2,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  local_100._M_head_impl._0_4_ = 7;
                                                  piVar2 = RepeatedField<int>::Get(local_c8,1);
                                                  local_108.data_._0_4_ = (float)*piVar2;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
                                                            ((internal *)local_f0,
                                                             "ImportEnum<TestAllTypes>::IMPORT_FOO",
                                                             "message.repeated_import_enum(1)",
                                                             (ImportEnum *)&local_100,
                                                             (ImportEnum *)&local_108);
                                                  if (local_f0[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_100)
                                                    ;
                                                    if (local_e8 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar14 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar14 = (local_e8->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_108,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x8d4,pcVar14);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_108,(Message *)&local_100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_108);
                                                  if (local_100._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_100._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_e8 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExpectRepeatedFieldsModified(const TestAllTypes& message) {
  // ModifyRepeatedFields only sets the second repeated element of each
  // field.  In addition to verifying this, we also verify that the first
  // element and size were *not* modified.
  ASSERT_EQ(2, message.repeated_int32_size());
  ASSERT_EQ(2, message.repeated_int64_size());
  ASSERT_EQ(2, message.repeated_uint32_size());
  ASSERT_EQ(2, message.repeated_uint64_size());
  ASSERT_EQ(2, message.repeated_sint32_size());
  ASSERT_EQ(2, message.repeated_sint64_size());
  ASSERT_EQ(2, message.repeated_fixed32_size());
  ASSERT_EQ(2, message.repeated_fixed64_size());
  ASSERT_EQ(2, message.repeated_sfixed32_size());
  ASSERT_EQ(2, message.repeated_sfixed64_size());
  ASSERT_EQ(2, message.repeated_float_size());
  ASSERT_EQ(2, message.repeated_double_size());
  ASSERT_EQ(2, message.repeated_bool_size());
  ASSERT_EQ(2, message.repeated_string_size());
  ASSERT_EQ(2, message.repeated_bytes_size());

  ASSERT_EQ(2, message.repeatedgroup_size());
  ASSERT_EQ(2, message.repeated_nested_message_size());
  ASSERT_EQ(2, message.repeated_foreign_message_size());
  ASSERT_EQ(2, message.repeated_import_message_size());
  ASSERT_EQ(2, message.repeated_lazy_message_size());
  ASSERT_EQ(2, message.repeated_nested_enum_size());
  ASSERT_EQ(2, message.repeated_foreign_enum_size());
  ASSERT_EQ(2, message.repeated_import_enum_size());

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  ASSERT_EQ(2, message.repeated_string_piece_size());
  ASSERT_EQ(2, message.repeated_cord_size());
#endif

  EXPECT_EQ(201, message.repeated_int32(0));
  EXPECT_EQ(202, message.repeated_int64(0));
  EXPECT_EQ(203, message.repeated_uint32(0));
  EXPECT_EQ(204, message.repeated_uint64(0));
  EXPECT_EQ(205, message.repeated_sint32(0));
  EXPECT_EQ(206, message.repeated_sint64(0));
  EXPECT_EQ(207, message.repeated_fixed32(0));
  EXPECT_EQ(208, message.repeated_fixed64(0));
  EXPECT_EQ(209, message.repeated_sfixed32(0));
  EXPECT_EQ(210, message.repeated_sfixed64(0));
  EXPECT_EQ(211, message.repeated_float(0));
  EXPECT_EQ(212, message.repeated_double(0));
  EXPECT_TRUE(message.repeated_bool(0));
  EXPECT_EQ("215", message.repeated_string(0));
  EXPECT_EQ("216", message.repeated_bytes(0));

  EXPECT_EQ(217, message.repeatedgroup(0).a());
  EXPECT_EQ(218, message.repeated_nested_message(0).bb());
  EXPECT_EQ(219, message.repeated_foreign_message(0).c());
  EXPECT_EQ(220, message.repeated_import_message(0).d());
  EXPECT_EQ(227, message.repeated_lazy_message(0).bb());

  EXPECT_EQ(TestAllTypes::BAR, message.repeated_nested_enum(0));
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAR,
            message.repeated_foreign_enum(0));
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAR,
            message.repeated_import_enum(0));


  // Actually verify the second (modified) elements now.
  EXPECT_EQ(501, message.repeated_int32(1));
  EXPECT_EQ(502, message.repeated_int64(1));
  EXPECT_EQ(503, message.repeated_uint32(1));
  EXPECT_EQ(504, message.repeated_uint64(1));
  EXPECT_EQ(505, message.repeated_sint32(1));
  EXPECT_EQ(506, message.repeated_sint64(1));
  EXPECT_EQ(507, message.repeated_fixed32(1));
  EXPECT_EQ(508, message.repeated_fixed64(1));
  EXPECT_EQ(509, message.repeated_sfixed32(1));
  EXPECT_EQ(510, message.repeated_sfixed64(1));
  EXPECT_EQ(511, message.repeated_float(1));
  EXPECT_EQ(512, message.repeated_double(1));
  EXPECT_TRUE(message.repeated_bool(1));
  EXPECT_EQ("515", message.repeated_string(1));
  EXPECT_EQ("516", message.repeated_bytes(1));

  EXPECT_EQ(517, message.repeatedgroup(1).a());
  EXPECT_EQ(518, message.repeated_nested_message(1).bb());
  EXPECT_EQ(519, message.repeated_foreign_message(1).c());
  EXPECT_EQ(520, message.repeated_import_message(1).d());
  EXPECT_EQ(527, message.repeated_lazy_message(1).bb());

  EXPECT_EQ(TestAllTypes::FOO, message.repeated_nested_enum(1));
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_FOO,
            message.repeated_foreign_enum(1));
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_FOO,
            message.repeated_import_enum(1));

}